

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLrelation.c
# Opt level: O3

char RDL_shareEdges(RDL_cfURF *RCFs,uint idx1,uint idx2,RDL_graph *graph,RDL_sPathInfo *spi)

{
  uint uVar1;
  char *edges;
  char *edges_00;
  ulong uVar2;
  char cVar3;
  
  uVar1 = graph->E;
  edges = (char *)calloc(1,(ulong)uVar1);
  edges_00 = (char *)calloc(1,(ulong)uVar1);
  RDL_findEdges(edges,RCFs->fams[idx1],graph,spi);
  RDL_findEdges(edges_00,RCFs->fams[idx2],graph,spi);
  if ((ulong)graph->E != 0) {
    uVar2 = 0;
    do {
      if ((edges[uVar2] == '\x01') && (edges_00[uVar2] == '\x01')) {
        cVar3 = '\x01';
        goto LAB_00105c29;
      }
      uVar2 = uVar2 + 1;
    } while (graph->E != uVar2);
  }
  cVar3 = '\0';
LAB_00105c29:
  free(edges);
  free(edges_00);
  return cVar3;
}

Assistant:

char RDL_shareEdges(RDL_cfURF *RCFs, unsigned idx1, unsigned idx2, RDL_graph *graph,
                    RDL_sPathInfo *spi)
{
  char *edges1;
  char *edges2; /*arrays of {0,1}^m that can store a set of edges with entries
  being 1 if the edge is contained and 0 otherwise*/
  unsigned i;
  char result = 0;
  edges1 = malloc(graph->E * sizeof(*edges1));
  edges2 = malloc(graph->E * sizeof(*edges2));

  memset(edges1, 0, graph->E * sizeof(*edges1));
  memset(edges2, 0, graph->E * sizeof(*edges2));

  RDL_findEdges(edges1, RCFs->fams[idx1], graph, spi);
  RDL_findEdges(edges2, RCFs->fams[idx2], graph, spi);

  for(i=0; i<graph->E; ++i)
  {
    if(edges1[i] == 1 && edges2[i] == 1)
    {
      result = 1;
      break;
    }
  }
  free(edges1);
  free(edges2);
  return result;
}